

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O1

ion_err_t linear_hash_get_record
                    (ion_fpos_t loc,ion_byte_t *key,ion_byte_t *value,ion_byte_t *status,
                    linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  ion_err_t iVar3;
  int iVar4;
  size_t sVar5;
  ion_byte_t *__ptr;
  undefined8 uStack_40;
  ion_byte_t aiStack_38 [8];
  
  uStack_40 = 0x10ccb8;
  iVar4 = fseek((FILE *)linear_hash->database,loc,0);
  iVar3 = '\r';
  if (iVar4 == 0) {
    sVar5 = linear_hash->record_total_size;
    lVar2 = -(sVar5 + 0xf & 0xfffffffffffffff0);
    __ptr = aiStack_38 + lVar2;
    __stream = (FILE *)linear_hash->database;
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10cce6;
    sVar5 = fread(__ptr,sVar5,1,__stream);
    iVar3 = '\b';
    if (sVar5 == 1) {
      *status = *__ptr;
      iVar4 = (linear_hash->super).record.key_size;
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10cd09;
      memcpy(key,aiStack_38 + lVar2 + 1,(long)iVar4);
      iVar4 = (linear_hash->super).record.key_size;
      iVar1 = (linear_hash->super).record.value_size;
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10cd20;
      memcpy(value,__ptr + (long)iVar4 + 1,(long)iVar1);
      iVar3 = '\0';
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
linear_hash_get_record(
	ion_fpos_t			loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* seek to location of record in file */
	if (0 != fseek(linear_hash->database, loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	/* cache record data from file */
	ion_byte_t *record = alloca(linear_hash->record_total_size);

	if (1 != fread(record, linear_hash->record_total_size, 1, linear_hash->database)) {
		return err_file_read_error;
	}

	/* read record data elements */
	memcpy(status, record, sizeof(*status));
	memcpy(key, record + sizeof(*status), linear_hash->super.record.key_size);
	memcpy(value, record + sizeof(*status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

	return err_ok;
}